

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<std::complex<long_double>_> * __thiscall
TPZVec<std::complex<long_double>_>::operator=
          (TPZVec<std::complex<long_double>_> *this,TPZVec<std::complex<long_double>_> *rval)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  complex<long_double> *pcVar6;
  long lVar7;
  long lVar8;
  complex<long_double> *pcVar9;
  ulong uVar10;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (complex<long_double> *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar10 = this->fNElements;
      pcVar6 = (complex<long_double> *)operator_new__(-(ulong)(uVar10 >> 0x3b != 0) | uVar10 * 0x20)
      ;
      if (uVar10 == 0) {
        this->fStore = pcVar6;
        uVar10 = 0;
      }
      else {
        pcVar9 = pcVar6;
        do {
          *(longdouble *)pcVar9->_M_value = (longdouble)0;
          *(longdouble *)((long)pcVar9->_M_value + 0x10) = (longdouble)0;
          pcVar9 = pcVar9 + 1;
        } while (pcVar9 != pcVar6 + uVar10);
        this->fStore = pcVar6;
        if (0 < (long)uVar10) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            pcVar6 = this->fStore;
            puVar1 = (undefined8 *)(rval->fStore->_M_value + lVar7);
            uVar3 = *puVar1;
            uVar4 = puVar1[1];
            puVar1 = (undefined8 *)(rval->fStore->_M_value + lVar7 + 0x10);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)(pcVar6->_M_value + lVar7 + 0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            puVar1 = (undefined8 *)(pcVar6->_M_value + lVar7);
            *puVar1 = uVar3;
            puVar1[1] = uVar4;
            lVar8 = lVar8 + 1;
            uVar10 = this->fNElements;
            lVar7 = lVar7 + 0x20;
          } while (lVar8 < (long)uVar10);
        }
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar10 = this->fNElements;
    }
    this->fNAlloc = uVar10;
    rval->fStore = (complex<long_double> *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}